

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleline.h
# Opt level: O0

void __thiscall
bandit::reporter::singleline::test_run_error(singleline *this,string *desc,test_run_error *err)

{
  ostream *poVar1;
  char *pcVar2;
  value_type local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  test_run_error *local_20;
  test_run_error *err_local;
  string *desc_local;
  singleline *this_local;
  
  local_20 = err;
  err_local = (test_run_error *)desc;
  desc_local = (string *)this;
  progress_base::test_run_error((progress_base *)this,desc,err);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::ostream::operator<<(local_198,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_198,"Failed to run \"");
  progress_base::current_context_name_abi_cxx11_(&local_1d8,(progress_base *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  poVar1 = std::operator<<(poVar1,"\": error \"");
  pcVar2 = (char *)(**(code **)(*(long *)local_20 + 0x10))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_colored_base).super_progress_base.test_run_errors_,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void test_run_error(const std::string& desc, const detail::test_run_error& err) override {
        progress_base::test_run_error(desc, err);

        std::stringstream ss;
        ss << std::endl;
        ss << "Failed to run \"" << current_context_name() << "\": error \"" << err.what() << "\"" << std::endl;

        test_run_errors_.push_back(ss.str());
      }